

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertions.c
# Opt level: O0

void assert_that_double_(char *file,int line,char *expression,double actual,Constraint *constraint)

{
  _func_void_TestReporter_ptr_char_ptr_int_int_char_ptr_varargs *p_Var1;
  code *pcVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int *piVar5;
  _Bool _Var6;
  byte bVar7;
  int iVar8;
  TestReporter *pTVar9;
  int *in_RCX;
  undefined8 in_RDX;
  int in_ESI;
  char *in_RDI;
  double in_XMM0_Qa;
  BoxedDouble *boxed_actual;
  double in_stack_ffffffffffffff50;
  undefined4 uVar10;
  CgreenValue local_50;
  void *local_38;
  int *local_30;
  double local_28;
  undefined8 local_20;
  int local_14;
  char *local_10;
  
  local_30 = in_RCX;
  local_28 = in_XMM0_Qa;
  local_20 = in_RDX;
  local_14 = in_ESI;
  local_10 = in_RDI;
  if ((in_RCX == (int *)0x0) || (_Var6 = is_not_comparing((Constraint *)0x106fb9), !_Var6)) {
    if (*local_30 != 3) {
      pTVar9 = get_test_reporter();
      p_Var1 = pTVar9->assert_true;
      pTVar9 = get_test_reporter();
      (*p_Var1)(pTVar9,local_10,local_14,0,
                "Only constraints of double type should be used with \'assert_that_double()\'.\n\t\tOther types of constraints, such as [%s], will probably fail comparison."
                ,*(undefined8 *)(local_30 + 2));
    }
    local_38 = (void *)box_double(in_stack_ffffffffffffff50);
    pTVar9 = get_test_reporter();
    p_Var1 = pTVar9->assert_true;
    pTVar9 = get_test_reporter();
    piVar5 = local_30;
    pcVar2 = *(code **)(local_30 + 6);
    make_cgreen_double_value(&local_50,local_28);
    uVar10 = local_50.value_size._4_4_;
    bVar7 = (*pcVar2)(piVar5);
    uVar3 = *(undefined8 *)(local_30 + 2);
    uVar4 = *(undefined8 *)(local_30 + 0x16);
    iVar8 = get_significant_figures();
    (*p_Var1)(pTVar9,local_10,local_14,(uint)(bVar7 & 1),
              "Expected [%s] to [%s] [%s] within [%d] significant figures\n\t\tactual value:\t\t\t[%08f]\n\t\texpected value:\t\t\t[%08f]"
              ,local_28,*(undefined8 *)(local_30 + 0x12),local_20,uVar3,uVar4,CONCAT44(uVar10,iVar8)
             );
    free(local_38);
    (**(code **)(local_30 + 4))(local_30);
  }
  else {
    pTVar9 = get_test_reporter();
    p_Var1 = pTVar9->assert_true;
    pTVar9 = get_test_reporter();
    (*p_Var1)(pTVar9,local_10,local_14,0,
              "Got constraint of type [%s],\n\t\tbut they are not allowed for assertions, only in mock expectations."
              ,*(undefined8 *)(local_30 + 2));
    (**(code **)(local_30 + 4))(local_30);
  }
  return;
}

Assistant:

void assert_that_double_(const char *file, int line, const char *expression, double actual, Constraint* constraint) {
    BoxedDouble* boxed_actual;

    if (NULL != constraint && is_not_comparing(constraint)) {
        (*get_test_reporter()->assert_true)(
                get_test_reporter(),
                file,
                line,
                false,
                "Got constraint of type [%s],\n"
                "\t\tbut they are not allowed for assertions, only in mock expectations.",
                constraint->name);

        constraint->destroy(constraint);

        return;
    }

    if (constraint->type != CGREEN_DOUBLE_COMPARER_CONSTRAINT) {
        (*get_test_reporter()->assert_true)(
                get_test_reporter(),
                file,
                line,
                false,
                "Only constraints of double type should be used with 'assert_that_double()'.\n"
                "\t\tOther types of constraints, such as [%s], will probably fail comparison.",
                constraint->name);
    }

    boxed_actual = (BoxedDouble*)box_double(actual);

    (*get_test_reporter()->assert_true)(get_test_reporter(), file, line,
            (*constraint->compare)(constraint, make_cgreen_double_value(actual)),
            "Expected [%s] to [%s] [%s] within [%d] significant figures\n"
            "\t\tactual value:\t\t\t[%08f]\n"
            "\t\texpected value:\t\t\t[%08f]",
            expression,
            constraint->name,
            constraint->expected_value_name,
            get_significant_figures(),
            actual,
            constraint->expected_value.value.double_value);

    free(boxed_actual);
    constraint->destroy(constraint);
}